

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall icu_63::Formattable::dispose(Formattable *this)

{
  Type TVar1;
  Formattable *pFVar2;
  CharString *this_00;
  Formattable *this_01;
  void *in_RSI;
  Formattable *this_local;
  
  TVar1 = this->fType;
  if (TVar1 == kString) {
    if ((this->fValue).fObject != (UObject *)0x0) {
      (*((this->fValue).fObject)->_vptr_UObject[1])();
    }
  }
  else if (TVar1 == kArray) {
    pFVar2 = (Formattable *)(this->fValue).fObject;
    if (pFVar2 != (Formattable *)0x0) {
      this_01 = pFVar2 + *(long *)((long)&pFVar2[-1].fBogus.fUnion + 0x30);
      while (pFVar2 != this_01) {
        this_01 = this_01 + -1;
        ~Formattable(this_01);
      }
      UMemory::operator_delete__((UMemory *)((long)&pFVar2[-1].fBogus.fUnion + 0x30),in_RSI);
    }
  }
  else if ((TVar1 == kObject) && ((this->fValue).fObject != (UObject *)0x0)) {
    (*((this->fValue).fObject)->_vptr_UObject[1])();
  }
  this->fType = kLong;
  (this->fValue).fObject = (UObject *)0x0;
  this_00 = this->fDecimalStr;
  if (this_00 != (CharString *)0x0) {
    CharString::~CharString(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  this->fDecimalStr = (CharString *)0x0;
  if (this->fDecimalQuantity != (DecimalQuantity *)0x0) {
    (*(this->fDecimalQuantity->super_IFixedDecimal)._vptr_IFixedDecimal[1])();
  }
  this->fDecimalQuantity = (DecimalQuantity *)0x0;
  return;
}

Assistant:

void Formattable::dispose()
{
    // Deletes the data value if necessary.
    switch (fType) {
    case kString:
        delete fValue.fString;
        break;
    case kArray:
        delete[] fValue.fArrayAndCount.fArray;
        break;
    case kObject:
        delete fValue.fObject;
        break;
    default:
        break;
    }

    fType = kLong;
    fValue.fInt64 = 0;

    delete fDecimalStr;
    fDecimalStr = NULL;

    delete fDecimalQuantity;
    fDecimalQuantity = NULL;
}